

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O3

void __thiscall
Matrix4f::Matrix4f(Matrix4f *this,float m00,float m01,float m02,float m03,float m10,float m11,
                  float m12,float m13,float m20,float m21,float m22,float m23,float m30,float m31,
                  float m32,float m33)

{
  this->m_elements[0] = m00;
  this->m_elements[1] = m10;
  this->m_elements[2] = m20;
  this->m_elements[3] = m30;
  this->m_elements[4] = m01;
  this->m_elements[5] = m11;
  this->m_elements[6] = m21;
  this->m_elements[7] = m31;
  this->m_elements[8] = m02;
  this->m_elements[9] = m12;
  this->m_elements[10] = m22;
  this->m_elements[0xb] = m32;
  this->m_elements[0xc] = m03;
  this->m_elements[0xd] = m13;
  this->m_elements[0xe] = m23;
  this->m_elements[0xf] = m33;
  return;
}

Assistant:

Matrix4f::Matrix4f( float m00, float m01, float m02, float m03,
				   float m10, float m11, float m12, float m13,
				   float m20, float m21, float m22, float m23,
				   float m30, float m31, float m32, float m33 )
{
	m_elements[ 0 ] = m00;
	m_elements[ 1 ] = m10;
	m_elements[ 2 ] = m20;
	m_elements[ 3 ] = m30;
	
	m_elements[ 4 ] = m01;
	m_elements[ 5 ] = m11;
	m_elements[ 6 ] = m21;
	m_elements[ 7 ] = m31;

	m_elements[ 8 ] = m02;
	m_elements[ 9 ] = m12;
	m_elements[ 10 ] = m22;
	m_elements[ 11 ] = m32;

	m_elements[ 12 ] = m03;
	m_elements[ 13 ] = m13;
	m_elements[ 14 ] = m23;
	m_elements[ 15 ] = m33;
}